

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QMatchData * __thiscall
QMap<QString,_QMatchData>::operator[](QMap<QString,_QMatchData> *this,QString *key)

{
  bool bVar1;
  QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
  *pQVar2;
  pointer ppVar3;
  value_type *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QString,_QMatchData>_>,_bool> pVar4;
  iterator i;
  QMap<QString,_QMatchData> copy;
  map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>
  *in_stack_ffffffffffffff08;
  QMatchData *pQVar5;
  QMap<QString,_QMatchData> *in_stack_ffffffffffffff10;
  map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>
  *this_00;
  pair<const_QString,_QMatchData> *this_01;
  _Self local_a8;
  _Self local_a0;
  undefined1 *local_98;
  map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>
  local_90 [2];
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff10->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff10,(QMap<QString,_QMatchData> *)in_stack_ffffffffffffff08);
  }
  else {
    memset(&local_98,0,8);
    QMap((QMap<QString,_QMatchData> *)0xa723a3);
  }
  detach(in_stack_ffffffffffffff10);
  local_a0._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
                *)0xa723c3);
  local_a0._M_node =
       (_Base_ptr)
       std::
       map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>
       ::find(in_stack_ffffffffffffff08,(key_type *)0xa723d4);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
                *)0xa723e3);
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>
       ::end(in_stack_ffffffffffffff08);
  bVar1 = std::operator==(&local_a0,&local_a8);
  if (bVar1) {
    pQVar2 = QtPrivate::
             QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
             ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
                           *)0xa72416);
    this_01 = (pair<const_QString,_QMatchData> *)&pQVar2->m;
    this_00 = local_90;
    QMatchData::QMatchData((QMatchData *)in_RSI);
    std::pair<const_QString,_QMatchData>::pair<QMatchData,_true>
              (this_01,(QString *)this_00,(QMatchData *)in_RSI);
    pVar4 = std::
            map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>
            ::insert(this_00,in_RSI);
    local_a0._M_node = (_Base_ptr)pVar4.first._M_node;
    local_10 = pVar4.second;
    local_18 = local_a0._M_node;
    std::pair<const_QString,_QMatchData>::~pair(in_RSI);
    QMatchData::~QMatchData((QMatchData *)0xa724a8);
  }
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_QString,_QMatchData>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_QString,_QMatchData>_> *)0xa724b2);
  pQVar5 = &ppVar3->second;
  ~QMap((QMap<QString,_QMatchData> *)0xa724c4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar5;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }